

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O1

t_threshold_tilde *
threshold_tilde_new(t_floatarg hithresh,t_floatarg hideadtime,t_floatarg lothresh,
                   t_floatarg lodeadtime)

{
  t_threshold_tilde *owner;
  _clock *p_Var1;
  _outlet *p_Var2;
  t_symbol *s2;
  
  owner = (t_threshold_tilde *)pd_new(threshold_tilde_class);
  owner->x_state = 0;
  owner->x_deadwait = 0.0;
  p_Var1 = clock_new(owner,threshold_tilde_tick);
  owner->x_clock = p_Var1;
  p_Var2 = outlet_new((t_object *)owner,&s_bang);
  owner->x_outlet1 = p_Var2;
  p_Var2 = outlet_new((t_object *)owner,&s_bang);
  owner->x_outlet2 = p_Var2;
  s2 = gensym("ft1");
  inlet_new((t_object *)owner,(t_pd *)owner,&s_float,s2);
  owner->x_msecpertick = 0.0;
  owner->x_f = 0.0;
  owner->x_hithresh = hithresh;
  if (lothresh <= hithresh) {
    hithresh = lothresh;
  }
  owner->x_hideadtime = hideadtime;
  owner->x_lothresh = hithresh;
  owner->x_lodeadtime = lodeadtime;
  return owner;
}

Assistant:

static t_threshold_tilde *threshold_tilde_new(t_floatarg hithresh,
    t_floatarg hideadtime, t_floatarg lothresh, t_floatarg lodeadtime)
{
    t_threshold_tilde *x = (t_threshold_tilde *)
        pd_new(threshold_tilde_class);
    x->x_state = 0;             /* low state */
    x->x_deadwait = 0;          /* no dead time */
    x->x_clock = clock_new(x, (t_method)threshold_tilde_tick);
    x->x_outlet1 = outlet_new(&x->x_obj, &s_bang);
    x->x_outlet2 = outlet_new(&x->x_obj, &s_bang);
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_float, gensym("ft1"));
    x->x_msecpertick = 0.;
    x->x_f = 0;
    threshold_tilde_set(x, hithresh, hideadtime, lothresh, lodeadtime);
    return (x);
}